

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsreada(bstring r,bStream *s,int n)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_48 [8];
  tagbstring x;
  char *b;
  int local_28;
  int ret;
  int l;
  int n_local;
  bStream *s_local;
  bstring r_local;
  
  if ((((s == (bStream *)0x0) || (s->buff == (bstring)0x0)) || (r == (bstring)0x0)) ||
     (((r->mlen < 1 || (r->slen < 0)) || ((r->mlen < r->slen || (n < 1)))))) {
    r_local._4_4_ = -1;
  }
  else {
    iVar1 = r->slen + n;
    if (iVar1 < 1) {
      r_local._4_4_ = -1;
    }
    else {
      local_28 = s->buff->slen;
      iVar2 = balloc(s->buff,s->maxBuffSz + 1);
      if (iVar2 == 0) {
        x._0_8_ = s->buff->data;
        x.data = (uchar *)x._0_8_;
        do {
          if (iVar1 <= local_28 + r->slen) {
            local_48._4_4_ = iVar1 - r->slen;
            iVar1 = bconcat(r,(bstring)local_48);
            s->buff->slen = local_28;
            if (iVar1 == 0) {
              bdelete(s->buff,0,local_48._4_4_);
            }
            return -(uint)(r->slen == 0);
          }
          local_48._4_4_ = local_28;
          iVar2 = bconcat(r,(bstring)local_48);
          if (iVar2 != 0) break;
          local_28 = iVar1 - r->slen;
          if (s->maxBuffSz < local_28) {
            local_28 = s->maxBuffSz;
          }
          sVar3 = (*s->readFnPtr)(x.data,1,(long)local_28,s->parm);
          local_28 = (int)sVar3;
        } while (0 < local_28);
        if (local_28 < 0) {
          local_28 = 0;
        }
        if (local_28 == 0) {
          s->isEOF = 1;
        }
        s->buff->slen = local_28;
        r_local._4_4_ = -(uint)(r->slen == 0);
      }
      else {
        r_local._4_4_ = -1;
      }
    }
  }
  return r_local._4_4_;
}

Assistant:

int bsreada (bstring r, struct bStream * s, int n) {
int l, ret;
char * b;
struct tagbstring x;

	if (s == NULL || s->buff == NULL || r == NULL || r->mlen <= 0
	 || r->slen < 0 || r->mlen < r->slen || n <= 0) return BSTR_ERR;

	n += r->slen;
	if (n <= 0) return BSTR_ERR;

	l = s->buff->slen;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	b = (char *) s->buff->data;
	x.data = (unsigned char *) b;

	do {
		if (l + r->slen >= n) {
			x.slen = n - r->slen;
			ret = bconcat (r, &x);
			s->buff->slen = l;
			if (BSTR_OK == ret) bdelete (s->buff, 0, x.slen);
			return BSTR_ERR & -(r->slen == 0);
		}

		x.slen = l;
		if (BSTR_OK != bconcat (r, &x)) break;

		l = n - r->slen;
		if (l > s->maxBuffSz) l = s->maxBuffSz;

		l = (int) s->readFnPtr (b, 1, l, s->parm);

	} while (l > 0);
	if (l < 0) l = 0;
	if (l == 0) s->isEOF = 1;
	s->buff->slen = l;
	return BSTR_ERR & -(r->slen == 0);
}